

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBoxAlgo.cpp
# Opt level: O1

void anon_unknown.dwarf_48f61::testPerturbedRayBox(Box3f *box,Line3f *ray,bool result)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  bool bVar4;
  ostream *poVar5;
  int iVar6;
  V3f ip;
  Rand48 random;
  V3f ip_1;
  Line3<float> local_68;
  Rand48 local_46;
  Vec3<float> local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    dir ~ ",10);
  poVar5 = Imath_3_2::operator<<((ostream *)&std::cout,&ray->dir);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", result = ",0xb);
  poVar5 = std::ostream::_M_insert<bool>(SUB81(poVar5,0));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  bVar4 = Imath_3_2::intersects<float>(box,ray,&local_68.pos);
  if (bVar4 != result) {
    __assert_fail("result == intersects (box, ray, ip)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                  ,0x2b8,
                  "void (anonymous namespace)::testPerturbedRayBox(const Box3f &, const Line3f &, bool)"
                 );
  }
  local_46._state[0] = 0xcf65;
  local_46._state[1] = 0x111d;
  local_46._state[2] = 0xcf65;
  iVar6 = 10000;
  do {
    local_68.pos.x = (ray->pos).x;
    local_68.pos.y = (ray->pos).y;
    uVar3 = *(undefined8 *)&(ray->pos).z;
    local_68.pos.z = (float)uVar3;
    local_68.dir.x = (float)((ulong)uVar3 >> 0x20);
    uVar1 = (ray->dir).y;
    uVar2 = (ray->dir).z;
    local_68.dir.y = (float)uVar1;
    local_68.dir.z = (float)uVar2;
    Imath_3_2::solidSphereRand<Imath_3_2::Vec3<float>,Imath_3_2::Rand48>
              ((Imath_3_2 *)&local_40,&local_46);
    local_68.dir.x = local_68.dir.x + local_40.x * 1e-25;
    local_68.dir.y = local_68.dir.y + local_40.y * 1e-25;
    local_68.dir.z = local_40.z * 1e-25 + local_68.dir.z;
    bVar4 = Imath_3_2::intersects<float>(box,&local_68,&local_40);
    if (bVar4 != result) {
      __assert_fail("result == intersects (box, ray1, ip)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                    ,0x2c4,
                    "void (anonymous namespace)::testPerturbedRayBox(const Box3f &, const Line3f &, bool)"
                   );
    }
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  return;
}

Assistant:

void
testPerturbedRayBox (const Box3f& box, const Line3f& ray, bool result)
{
    cout << "    dir ~ " << ray.dir << ", result = " << result << endl;

    {
        V3f ip;
        assert (result == intersects (box, ray, ip));
    }

    Rand48      random (19);
    const float e = 1e-25f;

    for (int i = 0; i < 10000; ++i)
    {
        Line3f ray1 (ray);
        ray1.dir += e * solidSphereRand<V3f> (random);

        V3f ip;
        assert (result == intersects (box, ray1, ip));
    }
}